

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O0

bool __thiscall Table::in_operator(Table *this,string *key)

{
  bool bVar1;
  _Self local_38;
  _Base_ptr local_30;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  _Self local_20;
  string *local_18;
  string *key_local;
  Table *this_local;
  
  local_18 = key;
  key_local = (string *)this;
  local_28._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->operators);
  local_30 = (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&this->operators);
  local_20._M_node =
       (_Base_ptr)
       std::find<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::__cxx11::string>
                 (local_28,(_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )local_30,local_18);
  local_38._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->operators);
  bVar1 = std::operator!=(&local_20,&local_38);
  return bVar1;
}

Assistant:

bool Table::in_operator(const std::string &key) {
    return std::find(operators.begin(), operators.end(), key) != operators.end();
}